

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O1

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ContIntStateScatterReactions
          (ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
           *this,uint off_L,ChVectorDynamic<> *L)

{
  long lVar1;
  double *pdVar2;
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
  ContIntStateScatterReactions
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             off_L,L);
  lVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)(off_L + 3) < lVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    (this->react_torque).m_data[0] = pdVar2[off_L + 3];
    if ((long)(ulong)(off_L + 4) < lVar1) {
      (this->react_torque).m_data[1] = pdVar2[off_L + 4];
      if ((long)(ulong)(off_L + 5) < lVar1) {
        (this->react_torque).m_data[2] = pdVar2[off_L + 5];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ContIntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::ContIntStateScatterReactions(off_L, L);

        react_torque.x() = L(off_L + 3);
        react_torque.y() = L(off_L + 4);
        react_torque.z() = L(off_L + 5);
    }